

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v8::detail::write_ptr<char,fmt::v8::appender,unsigned_long>
                   (appender out,unsigned_long value,basic_format_specs<char> *specs)

{
  ulong uVar1;
  size_t sVar2;
  size_t size;
  long lVar3;
  char *pcVar4;
  long lVar5;
  buffer<char> *buf;
  unsigned_long uVar6;
  undefined1 auVar7 [8];
  bool bVar8;
  undefined8 uStack_40;
  char local_38 [24];
  undefined1 local_20 [8];
  anon_class_16_2_92d121e5 write;
  
  size = 2;
  uVar6 = value;
  do {
    sVar2 = size;
    size = sVar2 + 1;
    bVar8 = 0xf < uVar6;
    uVar6 = uVar6 >> 4;
  } while (bVar8);
  write.value._0_4_ = (int)sVar2 - 1;
  local_20 = (undefined1  [8])value;
  if (specs == (basic_format_specs<char> *)0x0) {
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                  0x18) <
        *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                 0x10) + 1U) {
      uStack_40 = 0x1279ec;
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
    }
    lVar3 = *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                     + 0x10);
    *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 0x10)
         = lVar3 + 1;
    *(undefined1 *)
     (*(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 8)
     + lVar3) = 0x30;
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                  0x18) <
        *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                 0x10) + 1U) {
      uStack_40 = 0x127a15;
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
    }
    lVar3 = *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                     + 0x10);
    *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 0x10)
         = lVar3 + 1;
    *(undefined1 *)
     (*(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 8)
     + lVar3) = 0x78;
    lVar3 = *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                     + 0x10);
    uVar1 = (ulong)(uint)write.value + lVar3;
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                  0x18) < uVar1) {
      lVar3 = 0;
    }
    else {
      *(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                0x10) = uVar1;
      lVar3 = lVar3 + *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>
                                      .container + 8);
    }
    lVar5 = (long)(int)(uint)write.value;
    if (lVar3 == 0) {
      pcVar4 = local_38 + lVar5 + -1;
      auVar7 = local_20;
      do {
        *pcVar4 = "0123456789abcdef"[SUB84(auVar7,0) & 0xf];
        pcVar4 = pcVar4 + -1;
        bVar8 = 0xf < (ulong)auVar7;
        auVar7 = (undefined1  [8])((ulong)auVar7 >> 4);
      } while (bVar8);
      uStack_40 = 0x127ace;
      out = copy_str_noinline<char,char*,fmt::v8::appender>(local_38,local_38 + lVar5,out);
    }
    else {
      pcVar4 = (char *)(lVar3 + lVar5);
      do {
        pcVar4 = pcVar4 + -1;
        *pcVar4 = "0123456789abcdef"[SUB84(local_20,0) & 0xf];
        bVar8 = 0xf < (ulong)local_20;
        local_20 = (undefined1  [8])((ulong)local_20 >> 4);
      } while (bVar8);
    }
  }
  else {
    uStack_40 = 0x1279cf;
    out = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_ptr<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,unsigned_long,fmt::v8::basic_format_specs<char>const*)::_lambda(fmt::v8::appender)_1_&>
                    (out,specs,size,size,(anon_class_16_2_92d121e5 *)local_20);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
         out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
}

Assistant:

auto write_ptr(OutputIt out, UIntPtr value,
               const basic_format_specs<Char>* specs) -> OutputIt {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  auto write = [=](reserve_iterator<OutputIt> it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_uint<4, Char>(it, value, num_digits);
  };
  return specs ? write_padded<align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}